

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

uint get_protocol_family(uint protocol)

{
  uint local_10;
  uint family;
  uint protocol_local;
  
  if (protocol - 1 < 2) {
    return 1;
  }
  if ((protocol == 4) || (protocol == 8)) {
    return 4;
  }
  if (protocol == 0x10) {
    return 0x10;
  }
  if (protocol == 0x20) {
    return 0x20;
  }
  if (protocol == 0x40) {
    return 0x40;
  }
  if ((protocol == 0x80) || (protocol == 0x100)) {
    return 0x80;
  }
  if (protocol == 0x200) {
    return 0x200;
  }
  if (protocol == 0x400) {
    return 0x400;
  }
  if (protocol == 0x800) {
    return 0x800;
  }
  if ((protocol == 0x1000) || (protocol == 0x2000)) {
    return 0x1000;
  }
  if ((protocol == 0x4000) || (protocol == 0x8000)) {
    return 0x4000;
  }
  if ((protocol == 0x10000) || (protocol == 0x20000)) {
    return 0x10000;
  }
  if (protocol == 0x40000) {
    return 0x40000;
  }
  if (protocol == 0x80000) {
LAB_0013f247:
    local_10 = 0x80000;
  }
  else {
    if (protocol != 0x100000) {
      if (protocol == 0x200000) {
        return 0x200000;
      }
      if (protocol == 0x400000) {
        return 0x400000;
      }
      if (protocol == 0x800000) goto LAB_0013f247;
      if (protocol != 0x1000000) {
        if (protocol == 0x2000000) {
          return 0x2000000;
        }
        if ((protocol != 0x4000000) && (protocol != 0x8000000)) {
          return 0;
        }
        return 0x4000000;
      }
    }
    local_10 = 0x100000;
  }
  return local_10;
}

Assistant:

static unsigned int get_protocol_family(unsigned int protocol)
{
  unsigned int family;

  switch(protocol) {
  case CURLPROTO_HTTP:
  case CURLPROTO_HTTPS:
    family = CURLPROTO_HTTP;
    break;

  case CURLPROTO_FTP:
  case CURLPROTO_FTPS:
    family = CURLPROTO_FTP;
    break;

  case CURLPROTO_SCP:
    family = CURLPROTO_SCP;
    break;

  case CURLPROTO_SFTP:
    family = CURLPROTO_SFTP;
    break;

  case CURLPROTO_TELNET:
    family = CURLPROTO_TELNET;
    break;

  case CURLPROTO_LDAP:
  case CURLPROTO_LDAPS:
    family = CURLPROTO_LDAP;
    break;

  case CURLPROTO_DICT:
    family = CURLPROTO_DICT;
    break;

  case CURLPROTO_FILE:
    family = CURLPROTO_FILE;
    break;

  case CURLPROTO_TFTP:
    family = CURLPROTO_TFTP;
    break;

  case CURLPROTO_IMAP:
  case CURLPROTO_IMAPS:
    family = CURLPROTO_IMAP;
    break;

  case CURLPROTO_POP3:
  case CURLPROTO_POP3S:
    family = CURLPROTO_POP3;
    break;

  case CURLPROTO_SMTP:
  case CURLPROTO_SMTPS:
      family = CURLPROTO_SMTP;
      break;

  case CURLPROTO_RTSP:
    family = CURLPROTO_RTSP;
    break;

  case CURLPROTO_RTMP:
  case CURLPROTO_RTMPS:
    family = CURLPROTO_RTMP;
    break;

  case CURLPROTO_RTMPT:
  case CURLPROTO_RTMPTS:
    family = CURLPROTO_RTMPT;
    break;

  case CURLPROTO_RTMPE:
    family = CURLPROTO_RTMPE;
    break;

  case CURLPROTO_RTMPTE:
    family = CURLPROTO_RTMPTE;
    break;

  case CURLPROTO_GOPHER:
    family = CURLPROTO_GOPHER;
    break;

  case CURLPROTO_SMB:
  case CURLPROTO_SMBS:
    family = CURLPROTO_SMB;
    break;

  default:
      family = 0;
      break;
  }

  return family;
}